

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O1

mi_page_t * mi_find_page(mi_heap_t *heap,size_t size,size_t huge_alignment)

{
  size_t sVar1;
  mi_page_t *pmVar2;
  
  if ((0x10000 < size) || (huge_alignment != 0)) {
    if (0xfffffffe0000 < size) {
      _mi_error_message(0x4b,"allocation request is too large (%zu bytes)\n",size);
      return (mi_page_t *)0x0;
    }
    pmVar2 = mi_large_huge_page_alloc(heap,size,huge_alignment);
    return pmVar2;
  }
  sVar1 = _mi_bin(size);
  pmVar2 = heap->pages[sVar1].first;
  if ((pmVar2 != (mi_page_t *)0x0) &&
     (_mi_page_free_collect(pmVar2,false), pmVar2->free != (mi_block_t *)0x0)) {
    pmVar2->field_0xf = pmVar2->field_0xf & 1;
    return pmVar2;
  }
  pmVar2 = mi_page_queue_find_free_ex(heap,heap->pages + sVar1,true);
  return pmVar2;
}

Assistant:

static mi_page_t* mi_find_page(mi_heap_t* heap, size_t size, size_t huge_alignment) mi_attr_noexcept {
  // huge allocation?
  const size_t req_size = size - MI_PADDING_SIZE;  // correct for padding_size in case of an overflow on `size`
  if mi_unlikely(req_size > (MI_MEDIUM_OBJ_SIZE_MAX - MI_PADDING_SIZE) || huge_alignment > 0) {
    if mi_unlikely(req_size > MI_MAX_ALLOC_SIZE) {
      _mi_error_message(EOVERFLOW, "allocation request is too large (%zu bytes)\n", req_size);
      return NULL;
    }